

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<char,_8U>::SmallVector(SmallVector<char,_8U> *this,SmallVector<char,_8U> *RHS)

{
  bool bVar1;
  SmallVector<char,_8U> *RHS_local;
  SmallVector<char,_8U> *this_local;
  
  SmallVectorImpl<char>::SmallVectorImpl(&this->super_SmallVectorImpl<char>,8);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<char>::operator=
              (&this->super_SmallVectorImpl<char>,&RHS->super_SmallVectorImpl<char>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }